

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

lua_Unsigned luaH_getn(Table *t)

{
  int iVar1;
  uint uVar2;
  lua_Unsigned lVar3;
  uint local_2c;
  uint local_28;
  uint i_1;
  uint i;
  uint limit;
  uint maxvicinity;
  uint asize;
  Table *t_local;
  
  uVar2 = t->asize;
  if (uVar2 != 0) {
    i_1 = *(uint *)t->array;
    if (i_1 == 0) {
      i_1 = 1;
    }
    iVar1 = arraykeyisempty(t,i_1);
    if (iVar1 != 0) {
      local_28 = 0;
      while( true ) {
        if (3 < local_28 || i_1 < 2) {
          uVar2 = binsearch(t,0,i_1);
          lVar3 = newhint(t,uVar2);
          return lVar3;
        }
        i_1 = i_1 - 1;
        iVar1 = arraykeyisempty(t,i_1);
        if (iVar1 == 0) break;
        local_28 = local_28 + 1;
      }
      lVar3 = newhint(t,i_1);
      return lVar3;
    }
    for (local_2c = 0; local_2c < 4 && i_1 < uVar2; local_2c = local_2c + 1) {
      iVar1 = arraykeyisempty(t,i_1 + 1);
      if (iVar1 != 0) {
        lVar3 = newhint(t,i_1);
        return lVar3;
      }
      i_1 = i_1 + 1;
    }
    iVar1 = arraykeyisempty(t,uVar2);
    if (iVar1 != 0) {
      uVar2 = binsearch(t,i_1,uVar2);
      lVar3 = newhint(t,uVar2);
      return lVar3;
    }
    *(uint *)t->array = uVar2;
  }
  if (((t->flags & 0x40) == 0) && (iVar1 = hashkeyisempty(t,(ulong)(uVar2 + 1)), iVar1 == 0)) {
    t_local = (Table *)hash_search(t,(ulong)uVar2);
  }
  else {
    t_local = (Table *)(ulong)uVar2;
  }
  return (lua_Unsigned)t_local;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned asize = t->asize;
  if (asize > 0) {  /* is there an array part? */
    const unsigned maxvicinity = 4;
    unsigned limit = *lenhint(t);  /* start with the hint */
    if (limit == 0)
      limit = 1;  /* make limit a valid index in the array */
    if (arraykeyisempty(t, limit)) {  /* t[limit] empty? */
      /* there must be a border before 'limit' */
      unsigned i;
      /* look for a border in the vicinity of the hint */
      for (i = 0; i < maxvicinity && limit > 1; i++) {
        limit--;
        if (!arraykeyisempty(t, limit))
          return newhint(t, limit);  /* 'limit' is a border */
      }
      /* t[limit] still empty; search for a border in [0, limit) */
      return newhint(t, binsearch(t, 0, limit));
    }
    else {  /* 'limit' is present in table; look for a border after it */
      unsigned i;
      /* look for a border in the vicinity of the hint */
      for (i = 0; i < maxvicinity && limit < asize; i++) {
        limit++;
        if (arraykeyisempty(t, limit))
          return newhint(t, limit - 1);  /* 'limit - 1' is a border */
      }
      if (arraykeyisempty(t, asize)) {  /* last element empty? */
        /* t[limit] not empty; search for a border in [limit, asize) */
        return newhint(t, binsearch(t, limit, asize));
      }
    }
    /* last element non empty; set a hint to speed up finding that again */
    /* (keys in the hash part cannot be hints) */
    *lenhint(t) = asize;
  }
  /* no array part or t[asize] is not empty; check the hash part */
  lua_assert(asize == 0 || !arraykeyisempty(t, asize));
  if (isdummy(t) || hashkeyisempty(t, asize + 1))
    return asize;  /* 'asize + 1' is empty */
  else  /* 'asize + 1' is also non empty */
    return hash_search(t, asize);
}